

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_br(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *args;
  element_type *peVar1;
  shared_ptr<vmips::VirtReg> local_1d8;
  shared_ptr<vmips::VirtReg> local_1c8;
  undefined1 local_1b8 [8];
  shared_ptr<vmips::VirtReg> ret;
  shared_ptr<vmips::VirtReg> val;
  shared_ptr<vmips::VirtReg> local_180;
  shared_ptr<vmips::VirtReg> local_170;
  shared_ptr<vmips::CFGNode> local_160;
  undefined1 local_150 [8];
  shared_ptr<vmips::VirtReg> mm;
  shared_ptr<vmips::VirtReg> r4;
  undefined1 local_128 [8];
  shared_ptr<vmips::VirtReg> r3;
  shared_ptr<vmips::CFGNode> c;
  shared_ptr<vmips::VirtReg> local_100;
  undefined4 local_ec;
  shared_ptr<vmips::VirtReg> local_e8;
  undefined1 local_d8 [8];
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br2;
  undefined1 local_b0 [8];
  shared_ptr<vmips::VirtReg> r2;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br1;
  undefined1 local_78 [8];
  shared_ptr<vmips::VirtReg> r1;
  undefined1 local_60 [8];
  shared_ptr<vmips::VirtReg> r0;
  shared_ptr<vmips::VirtReg> zero;
  shared_ptr<vmips::CFGNode> local_30;
  undefined4 local_1c;
  undefined1 local_18 [8];
  shared_ptr<vmips::Function> f;
  
  local_1c = 2;
  std::make_shared<vmips::Function,char_const(&)[5],int>((char (*) [5])local_18,(int *)"test");
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::entry();
  std::shared_ptr<vmips::CFGNode>::~shared_ptr(&local_30);
  vmips::get_special((int)&r0 + k0);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  r1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)local_60,(shared_ptr<vmips::VirtReg> *)peVar1,
             (int *)&r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)local_78,(shared_ptr<vmips::VirtReg> *)peVar1,
             (int *)&r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *)
             &r2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,peVar1,
             (shared_ptr<vmips::VirtReg> *)local_60,(shared_ptr<vmips::VirtReg> *)local_78);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  br2.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)local_b0,(shared_ptr<vmips::VirtReg> *)peVar1,
             (int *)&r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  args = &r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  vmips::Function::
  branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *)local_d8,
             peVar1,(shared_ptr<vmips::VirtReg> *)args,(shared_ptr<vmips::VirtReg> *)args);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  local_ec = 1;
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&local_e8,(shared_ptr<vmips::VirtReg> *)peVar1,
             (int *)&r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_e8);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::switch_to(peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&local_100,(shared_ptr<vmips::VirtReg> *)peVar1,
             (int *)&r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_100);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::join
            ((shared_ptr *)
             &r3.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::switch_to(peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)local_128,(shared_ptr<vmips::VirtReg> *)peVar1,
             (int *)&r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)
             &mm.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<vmips::VirtReg> *)peVar1,(shared_ptr<vmips::VirtReg> *)local_128);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)local_150,(shared_ptr<vmips::VirtReg> *)peVar1,
             (shared_ptr<vmips::VirtReg> *)local_60);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::join((shared_ptr *)&local_160,peVar1);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr(&local_160);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::add_phi(peVar1,local_b0);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&local_170,(shared_ptr<vmips::VirtReg> *)peVar1,
             (shared_ptr<vmips::VirtReg> *)
             &mm.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_170);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((Function *)&local_180,(shared_ptr<vmips::VirtReg> *)peVar1,
             (int *)&mm.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_180);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)
             &val.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<vmips::VirtReg> *)peVar1,
             (shared_ptr<vmips::VirtReg> *)
             &mm.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr
            ((shared_ptr<vmips::VirtReg> *)
             &val.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)
             &ret.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<vmips::VirtReg> *)peVar1,(shared_ptr<vmips::VirtReg> *)local_78);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            ((weak_ptr<vmips::Function> *)&local_1c8,(shared_ptr<vmips::Function> *)local_18);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)local_1b8,(weak_ptr<vmips::Function> *)peVar1,&local_1c8);
  std::weak_ptr<vmips::Function>::~weak_ptr((weak_ptr<vmips::Function> *)&local_1c8);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&local_1d8,(shared_ptr<vmips::VirtReg> *)peVar1,
             (shared_ptr<vmips::VirtReg> *)local_1b8);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_1d8);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar1);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::color();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar1);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::scan_overlap();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar1);
  std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_18);
  vmips::Function::handle_alloca();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  vmips::Function::output((ostream *)peVar1);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_1b8);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr
            ((shared_ptr<vmips::VirtReg> *)
             &ret.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_150);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr
            ((shared_ptr<vmips::VirtReg> *)
             &mm.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_128);
  std::shared_ptr<vmips::CFGNode>::~shared_ptr
            ((shared_ptr<vmips::CFGNode> *)
             &r3.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::~pair
            ((pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *)local_d8);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_b0);
  std::pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>::~pair
            ((pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *)
             &r2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_78);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_60);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr
            ((shared_ptr<vmips::VirtReg> *)
             &r0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_18);
  return;
}

Assistant:

void test_br() {
    auto f  = std::make_shared<Function>("test", 2);
    f->entry();
    auto zero = get_special(SpecialReg::zero);;
    auto r0 = f->append<addi>(zero, 1);
    auto r1 = f->append<addi>(zero, 1);
    auto br1 = f->branch<beq>(r0, r1);

    //branch 1
    auto r2 = f->append<addi>(zero, 1);
    auto br2 = f->branch<beq>(zero, zero);

    //branch 11
    f->append<addi>(zero, 1);

    //branch 12
    f->switch_to(br2.second);
    f->append<addi>(zero, 1);

    auto c = f->join(br2.first, br2.second);

    //branch 2
    f->switch_to(br1.second);
    auto r3 = f->append<addi>(zero, 2);
    auto r4 = f->append<add>(r3, r3);
    auto mm = f->append<add>(r0, r0);

    f->join(c, br1.second);
    f->add_phi(r2, r4);
    f->append<add>(r4, r4);
    f->append<addi>(r4, 4);
    f->append<add>(r4, r0);
    auto val = f->append<add>(r1, r0);
    auto ret = f->call(f, val);
    f->append<add>(ret, ret);
    f->output(std::cout);
    std::cout << std::endl;
    f->color();
    std::cout << std::endl;
    f->output(std::cout);
    f->scan_overlap();
    std::cout << std::endl;
    f->output(std::cout);
    f->handle_alloca();
    std::cout << std::endl;
    f->output(std::cout);

}